

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_Test::
TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_Test
          (TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks_Test
           *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).memoryAllocatorStash.
  originalNewAllocator = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).memoryAllocatorStash.
  originalNewArrayAllocator = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyReporter =
       (MemoryLeakFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).memoryAllocatorStash.
  originalMallocAllocator = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).failureReporter =
       (MemoryLeakFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyDetector =
       (DummyMemoryLeakDetector *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).detector =
       (MemoryLeakDetector *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)&PTR__Utest_0034f3d0;
  GlobalMemoryAllocatorStash::GlobalMemoryAllocatorStash
            (&(this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
              memoryAllocatorStash);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)&PTR__Utest_0034e5d0;
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, turnOffNewOverloadsNoThrowCausesNoAdditionalLeaks)
{
#undef new
    size_t storedAmountOfLeaks = detector->totalMemoryLeaks(mem_leak_period_all);

    char* nonMemoryNoThrow = new (std::nothrow) char;
    char* nonArrayMemoryNoThrow = new (std::nothrow) char[10];
    char* nonArrayMemoryThrow = new char[10];

    LONGS_EQUAL(storedAmountOfLeaks, detector->totalMemoryLeaks(mem_leak_period_all));

    ::operator delete(nonMemoryNoThrow, std::nothrow);
    ::operator delete[](nonArrayMemoryNoThrow, std::nothrow);
    ::operator delete[](nonArrayMemoryThrow, std::nothrow);
#ifdef CPPUTEST_USE_NEW_MACROS
    #include "CppUTest/MemoryLeakDetectorNewMacros.h"
#endif
}